

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O2

void merge(int n,uint32_t *x,int step)

{
  uint32_t *x_00;
  long lVar1;
  long lVar2;
  uint32_t *y;
  
  if (n == 1) {
    minmax(x,x + step);
    return;
  }
  merge(n / 2,x,step * 2);
  lVar2 = (long)step;
  x_00 = x + lVar2;
  merge(n / 2,x_00,step * 2);
  y = x + lVar2 * 2;
  for (lVar1 = 1; lVar1 < n * 2 + -1; lVar1 = lVar1 + 2) {
    minmax(x_00,y);
    x_00 = x_00 + lVar2 * 2;
    y = y + lVar2 * 2;
  }
  return;
}

Assistant:

static void merge(int n,uint32_t x[n],int step)
{
  int i;
  if (n == 1)
    minmax(&x[0],&x[step]);
  else {
    merge(n / 2,x,step * 2);
    merge(n / 2,x + step,step * 2);
    for (i = 1;i < 2*n-1;i += 2)
      minmax(&x[i * step],&x[(i + 1) * step]);
  }
}